

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean_object.cpp
# Opt level: O2

void __thiscall
mjs::boolean_object::do_debug_print_extra
          (boolean_object *this,wostream *os,int param_2,int param_3,int indent)

{
  wostream *pwVar1;
  char *pcVar2;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  local_38[0] = local_28;
  std::__cxx11::wstring::_M_construct((ulong)local_38,indent);
  pwVar1 = std::operator<<(os,(wstring *)local_38);
  pwVar1 = std::operator<<(pwVar1,"[[Value]]: ");
  pcVar2 = "false";
  if ((this->super_object).field_0x1d != '\0') {
    pcVar2 = "true";
  }
  pwVar1 = std::operator<<(pwVar1,pcVar2);
  std::operator<<(pwVar1,"\n");
  std::__cxx11::wstring::~wstring((wstring *)local_38);
  return;
}

Assistant:

void do_debug_print_extra(std::wostream& os, int, int, int indent) const override {
        os << std::wstring(indent, ' ') << "[[Value]]: " << (value_?"true":"false") << "\n";
    }